

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::reallocateAndGrow
          (QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *this,
          GrowthPosition where,qsizetype n,
          QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *old)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  Data *pDVar3;
  pair<QPersistentModelIndex,_unsigned_int> *ppVar4;
  bool bVar5;
  long lVar6;
  undefined1 *puVar7;
  long lVar8;
  pair<QPersistentModelIndex,_unsigned_int> *this_00;
  pair<QPersistentModelIndex,_unsigned_int> *ppVar9;
  pair<QPersistentModelIndex,_unsigned_int> *other;
  long in_FS_OFFSET;
  QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)0x0 &&
      where == GrowsAtEnd) {
    pDVar3 = this->d;
    if (pDVar3 == (Data *)0x0) {
      bVar5 = true;
    }
    else {
      bVar5 = 1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar5)) {
      if (pDVar3 == (Data *)0x0) {
        lVar6 = 0;
        lVar8 = 0;
      }
      else {
        lVar6 = (pDVar3->super_QArrayData).alloc;
        lVar8 = (this->size - (pDVar3->super_QArrayData).alloc) +
                ((long)((long)this->ptr -
                       ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
                >> 4);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QtPrivate::QMovableArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_>::reallocate
                  ((QMovableArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_> *)this,
                   lVar6 + n + lVar8,Grow);
        return;
      }
      goto LAB_00471fd4;
    }
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (pair<QPersistentModelIndex,_unsigned_int> *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_58,this,n,where);
  ppVar4 = local_58.ptr;
  if ((n < 1) || (local_58.ptr != (pair<QPersistentModelIndex,_unsigned_int> *)0x0)) {
    puVar7 = (undefined1 *)local_58.size;
    if (this->size != 0) {
      lVar6 = this->size + (n >> 0x3f & n);
      if (this->d == (Data *)0x0) {
        bVar5 = true;
      }
      else {
        bVar5 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      }
      other = this->ptr;
      ppVar9 = other + lVar6;
      if ((old != (QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)0x0) ||
         (bVar5)) {
        if ((lVar6 != 0) && (0 < lVar6)) {
          do {
            this_00 = ppVar4 + local_58.size;
            QPersistentModelIndex::QPersistentModelIndex(&this_00->first,&other->first);
            this_00->second = other->second;
            other = other + 1;
            local_58.size = local_58.size + 1;
            puVar7 = (undefined1 *)local_58.size;
          } while (other < ppVar9);
        }
      }
      else if ((lVar6 != 0) && (0 < lVar6)) {
        lVar6 = 0;
        do {
          puVar1 = (undefined8 *)((long)&(other->first).d + lVar6);
          uVar2 = *puVar1;
          *puVar1 = 0;
          *(undefined8 *)((long)&local_58.ptr[local_58.size].first.d + lVar6) = uVar2;
          *(undefined4 *)((long)&local_58.ptr[local_58.size].second + lVar6) =
               *(undefined4 *)(puVar1 + 1);
          puVar7 = puVar7 + 1;
          lVar6 = lVar6 + 0x10;
        } while ((pair<QPersistentModelIndex,_unsigned_int> *)(puVar1 + 2) < ppVar9);
      }
    }
    local_58.size = (qsizetype)puVar7;
    pDVar3 = this->d;
    ppVar4 = this->ptr;
    this->d = local_58.d;
    this->ptr = local_58.ptr;
    puVar7 = (undefined1 *)this->size;
    this->size = local_58.size;
    local_58.d = pDVar3;
    local_58.ptr = ppVar4;
    local_58.size = (qsizetype)puVar7;
    if (old != (QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)0x0) {
      local_58.d = old->d;
      local_58.ptr = old->ptr;
      old->d = pDVar3;
      old->ptr = ppVar4;
      local_58.size = old->size;
      old->size = (qsizetype)puVar7;
    }
    ~QArrayDataPointer(&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    qBadAlloc();
  }
LAB_00471fd4:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }